

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  size_t sVar1;
  byte bVar2;
  pointer pppuVar3;
  pointer pppuVar4;
  uchar **ppuVar5;
  byte bVar6;
  uint j;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t N_00;
  long lVar10;
  uint j_1;
  size_t N_01;
  uchar **__dest;
  uchar **ppuVar11;
  uchar **ppuVar12;
  size_t N_02;
  array<vector_bagwell<unsigned_char_*,_16U>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  vector_bagwell<unsigned_char_*,_16U> local_d8;
  vector_bagwell<unsigned_char_*,_16U> vStack_b0;
  vector_bagwell<unsigned_char_*,_16U> local_88;
  pointer local_58;
  byte abStack_50 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  local_88._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._insertpos = (uchar **)0x0;
  local_88._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_b0._insertpos = (uchar **)0x0;
  vStack_b0._left_in_block = 0;
  vStack_b0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_b0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._left_in_block = 0;
  vStack_b0._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._insertpos = (uchar **)0x0;
  local_d8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._left_in_block = 0;
  bVar6 = pseudo_median<unsigned_char>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    ppuVar11 = strings;
    do {
      lVar7 = 0;
      do {
        if (ppuVar11[lVar7] == (uchar *)0x0) goto LAB_0021e1a7;
        abStack_50[lVar7] = ppuVar11[lVar7][depth];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      lVar7 = 0;
      ppuVar12 = ppuVar11;
      do {
        vector_bagwell<unsigned_char_*,_16U>::push_back
                  (&local_d8 +
                   (ulong)(abStack_50[lVar7] == bVar6) + (ulong)(bVar6 < abStack_50[lVar7]) * 2,
                   ppuVar12);
        lVar7 = lVar7 + 1;
        ppuVar12 = ppuVar12 + 1;
      } while (lVar7 != 0x20);
      uVar9 = uVar9 + 0x20;
      ppuVar11 = ppuVar11 + 0x20;
    } while (uVar9 < (N & 0xffffffffffffffe0));
  }
  lVar7 = N - uVar9;
  if (uVar9 <= N && lVar7 != 0) {
    ppuVar11 = strings + uVar9;
    do {
      if (*ppuVar11 == (uchar *)0x0) {
LAB_0021e1a7:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar2 = (*ppuVar11)[depth];
      vector_bagwell<unsigned_char_*,_16U>::push_back
                (&local_d8 + (ulong)(bVar2 == bVar6) + (ulong)(bVar6 < bVar2) * 2,ppuVar11);
      ppuVar11 = ppuVar11 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  ppuVar5 = local_88._insertpos;
  ppuVar12 = vStack_b0._insertpos;
  ppuVar11 = local_d8._insertpos;
  pppuVar3 = local_d8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_d8._insertpos == (uchar **)0x0) {
    N_02 = 0;
  }
  else {
    N_02 = (long)local_d8._insertpos +
           ((long)((1 << ((char)((uint)((int)local_d8._index_block.
                                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_d8._index_block.
                                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 3U &
                         0x1f)) + -0x10) * 8 -
           (long)local_d8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]) >> 3;
  }
  if (vStack_b0._insertpos == (uchar **)0x0) {
    N_00 = 0;
  }
  else {
    N_00 = (long)vStack_b0._insertpos +
           ((long)((1 << ((char)((uint)((int)vStack_b0._index_block.
                                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)vStack_b0._index_block.
                                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 3U &
                         0x1f)) + -0x10) * 8 -
           (long)vStack_b0._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]) >> 3;
  }
  if (local_88._insertpos == (uchar **)0x0) {
    N_01 = 0;
  }
  else {
    N_01 = (long)local_88._insertpos +
           ((long)((1 << ((char)((uint)((int)local_88._index_block.
                                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)local_88._index_block.
                                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 3U &
                         0x1f)) + -0x10) * 8 -
           (long)local_88._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]) >> 3;
  }
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_bagwell<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (N_02 != 0) {
    local_58 = local_d8._index_block.
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    __dest = strings;
    if (8 < (ulong)((long)local_d8._index_block.
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d8._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar8 = (long)local_d8._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d8._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar9 = 2;
      if (2 < uVar8) {
        uVar9 = uVar8;
      }
      lVar7 = 0x10;
      lVar10 = 0;
      do {
        if (lVar7 != 0) {
          memmove(__dest,pppuVar3[lVar10],lVar7 * 8);
        }
        __dest = __dest + lVar7;
        lVar7 = lVar7 * 2;
        lVar10 = lVar10 + 1;
      } while (uVar9 - 1 != lVar10);
    }
    sVar1 = (long)ppuVar11 - (long)local_58[-1];
    if (sVar1 != 0) {
      memmove(__dest,local_58[-1],sVar1);
    }
  }
  pppuVar4 = vStack_b0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar3 = vStack_b0._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (N_00 != 0) {
    ppuVar11 = strings + N_02;
    if (8 < (ulong)((long)vStack_b0._index_block.
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)vStack_b0._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar8 = (long)vStack_b0._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vStack_b0._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar9 = 2;
      if (2 < uVar8) {
        uVar9 = uVar8;
      }
      lVar7 = 0x10;
      lVar10 = 0;
      do {
        if (lVar7 != 0) {
          memmove(ppuVar11,pppuVar3[lVar10],lVar7 * 8);
        }
        ppuVar11 = ppuVar11 + lVar7;
        lVar7 = lVar7 * 2;
        lVar10 = lVar10 + 1;
      } while (uVar9 - 1 != lVar10);
    }
    sVar1 = (long)ppuVar12 - (long)pppuVar4[-1];
    if (sVar1 != 0) {
      memmove(ppuVar11,pppuVar4[-1],sVar1);
    }
  }
  pppuVar4 = local_88._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar3 = local_88._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (N_01 != 0) {
    ppuVar11 = strings + N_02 + N_00;
    if (8 < (ulong)((long)local_88._index_block.
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88._index_block.
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start)) {
      uVar8 = (long)local_88._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_88._index_block.
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar9 = 2;
      if (2 < uVar8) {
        uVar9 = uVar8;
      }
      lVar7 = 0x10;
      lVar10 = 0;
      do {
        if (lVar7 != 0) {
          memmove(ppuVar11,pppuVar3[lVar10],lVar7 * 8);
        }
        ppuVar11 = ppuVar11 + lVar7;
        lVar7 = lVar7 * 2;
        lVar10 = lVar10 + 1;
      } while (uVar9 - 1 != lVar10);
    }
    sVar1 = (long)ppuVar5 - (long)pppuVar4[-1];
    if (sVar1 != 0) {
      memmove(ppuVar11,pppuVar4[-1],sVar1);
    }
  }
  vector_bagwell<unsigned_char_*,_16U>::clear(&local_d8);
  vector_bagwell<unsigned_char_*,_16U>::clear(&vStack_b0);
  vector_bagwell<unsigned_char_*,_16U>::clear(&local_88);
  multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>(strings,N_02,depth);
  if (bVar6 != 0) {
    multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
              (strings + N_02,N_00,depth + 1);
  }
  multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
            (strings + N_02 + N_00,N_01,depth);
  lVar7 = 0x50;
  do {
    vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell
              ((vector_bagwell<unsigned_char_*,_16U> *)
               ((long)&local_d8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}